

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer.cpp
# Opt level: O0

MPP_RET mpp_buffer_group_get
                  (MppBufferGroup *group,MppBufferType type,MppBufferMode mode,char *tag,
                  char *caller)

{
  char *caller_local;
  char *tag_local;
  MppBufferMode mode_local;
  MppBufferType type_local;
  MppBufferGroup *group_local;
  
  if (((group == (MppBufferGroup *)0x0) || (1 < (int)mode)) ||
     (MPP_BUFFER_TYPE_DMA_HEAP < (type & 0xffff))) {
    _mpp_log_l(2,"mpp_buffer","input invalid group %p mode %d type %d from %s\n",
               "mpp_buffer_group_get",group,(ulong)mode,type,caller);
    group_local._4_4_ = MPP_ERR_UNKNOW;
  }
  else {
    group_local._4_4_ = mpp_buffer_group_init((MppBufferGroupImpl **)group,tag,caller,mode,type);
  }
  return group_local._4_4_;
}

Assistant:

MPP_RET mpp_buffer_group_get(MppBufferGroup *group, MppBufferType type, MppBufferMode mode,
                             const char *tag, const char *caller)
{
    if (NULL == group ||
        mode >= MPP_BUFFER_MODE_BUTT ||
        (type & MPP_BUFFER_TYPE_MASK) >= MPP_BUFFER_TYPE_BUTT) {
        mpp_err_f("input invalid group %p mode %d type %d from %s\n",
                  group, mode, type, caller);
        return MPP_ERR_UNKNOW;
    }

    return mpp_buffer_group_init((MppBufferGroupImpl**)group, tag, caller, mode, type);
}